

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffrdef(fitsfile *fptr,int *status)

{
  long lVar1;
  LONGLONG LVar2;
  int iVar3;
  FITSfile *pFVar4;
  int tstatus;
  LONGLONG naxis2;
  int dummy;
  LONGLONG pcount;
  char comm [73];
  char valstring [71];
  char card [81];
  
  tstatus = 0;
  iVar3 = *status;
  if (iVar3 < 1) {
    pFVar4 = fptr->Fptr;
    if (fptr->HDUposition == pFVar4->curhdu) {
      if (pFVar4->writemode == 1) {
        if (pFVar4->datastart != -1) {
          LVar2 = naxis2;
          if (pFVar4->hdutype != 0) {
            ffmaky(fptr,2,status);
            iVar3 = ffgkyjj(fptr,"NAXIS2",&naxis2,comm,&tstatus);
            pFVar4 = fptr->Fptr;
            lVar1 = pFVar4->numrows;
            LVar2 = lVar1;
            if (((iVar3 < 1) && (LVar2 = naxis2, naxis2 < lVar1)) && (pFVar4->origrows == naxis2)) {
              snprintf(valstring,0x47,"%.0f",(double)lVar1);
              ffmkky("NAXIS2",valstring,comm,card,status);
              ffmkey(fptr,card,status);
              pFVar4 = fptr->Fptr;
              LVar2 = naxis2;
            }
          }
          naxis2 = LVar2;
          if (0 < pFVar4->heapsize) {
            ffmaky(fptr,2,status);
            ffgkyjj(fptr,"PCOUNT",&pcount,comm,status);
            lVar1 = fptr->Fptr->heapsize;
            if (lVar1 != pcount) {
              ffmkyj(fptr,"PCOUNT",lVar1,comm,status);
            }
          }
        }
        iVar3 = ffwend(fptr,status);
        if (iVar3 < 1) {
          ffrhdu(fptr,&dummy,status);
        }
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int ffrdef(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  ReDEFine the structure of a data unit.  This routine re-reads
  the CHDU header keywords to determine the structure and length of the
  current data unit.  This redefines the start of the next HDU.
*/
{
    int dummy, tstatus = 0;
    LONGLONG naxis2;
    LONGLONG pcount;
    char card[FLEN_CARD], comm[FLEN_COMMENT], valstring[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->writemode == 1) /* write access to the file? */
    {
        /* don't need to check NAXIS2 and PCOUNT if data hasn't been written */
        if ((fptr->Fptr)->datastart != DATA_UNDEFINED)
        {
          /* update NAXIS2 keyword if more rows were written to the table */
          /* and if the user has not explicitly reset the NAXIS2 value */
          if ((fptr->Fptr)->hdutype != IMAGE_HDU)
          {
            ffmaky(fptr, 2, status);
            if (ffgkyjj(fptr, "NAXIS2", &naxis2, comm, &tstatus) > 0)
            {
                /* Couldn't read NAXIS2 (odd!);  in certain circumstances */
                /* this may be normal, so ignore the error. */
                naxis2 = (fptr->Fptr)->numrows;
            }

            if ((fptr->Fptr)->numrows > naxis2
              && (fptr->Fptr)->origrows == naxis2)
              /* if origrows is not equal to naxis2, then the user must */
              /* have manually modified the NAXIS2 keyword value, and */
              /* we will assume that the current value is correct. */
            {
              /* would be simpler to just call ffmkyj here, but this */
              /* would force linking in all the modkey & putkey routines */

              /* print as double because the 64-bit int conversion */
              /* is platform dependent (%lld, %ld, %I64 )          */

              snprintf(valstring,FLEN_VALUE, "%.0f", (double) ((fptr->Fptr)->numrows));

              ffmkky("NAXIS2", valstring, comm, card, status);
              ffmkey(fptr, card, status);
            }
          }

          /* if data has been written to variable length columns in a  */
          /* binary table, then we may need to update the PCOUNT value */
          if ((fptr->Fptr)->heapsize > 0)
          {
            ffmaky(fptr, 2, status);
            ffgkyjj(fptr, "PCOUNT", &pcount, comm, status);
            if ((fptr->Fptr)->heapsize != pcount)
            {
              ffmkyj(fptr, "PCOUNT", (fptr->Fptr)->heapsize, comm, status);
            }
          }
        }

        if (ffwend(fptr, status) <= 0)     /* rewrite END keyword and fill */
        {
            ffrhdu(fptr, &dummy, status);  /* re-scan the header keywords  */
        }
    }
    return(*status);
}